

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gpio.c
# Opt level: O3

mraa_result_t mraa_gpio_mode(mraa_gpio_context dev,mraa_gpio_mode_t mode)

{
  uint uVar1;
  mraa_adv_func_t *pmVar2;
  _gpio_group *p_Var3;
  _func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *UNRECOVERED_JUMPTABLE;
  mraa_result_t mVar4;
  uint uVar5;
  int iVar6;
  int *piVar7;
  char *pcVar8;
  mraa_gpiod_line_info *__ptr;
  ssize_t sVar9;
  long lVar10;
  size_t __n;
  __u32 _Var11;
  ulong uVar12;
  char bu [64];
  char filepath [64];
  undefined8 local_b8;
  undefined1 local_b0;
  char local_78 [72];
  
  if (dev == (mraa_gpio_context)0x0) {
    syslog(3,"gpio: mode: context is invalid");
    return MRAA_ERROR_INVALID_HANDLE;
  }
  pmVar2 = dev->advance_func;
  if (pmVar2 != (mraa_adv_func_t *)0x0) {
    if (pmVar2->gpio_mode_replace != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0)
    {
      mVar4 = (*pmVar2->gpio_mode_replace)(dev,mode);
      return mVar4;
    }
    if ((pmVar2->gpio_mode_pre != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0) &&
       (mVar4 = (*pmVar2->gpio_mode_pre)(dev,mode), mVar4 != MRAA_SUCCESS)) {
      return mVar4;
    }
  }
  if (plat->chardev_capable != 0) {
    _mraa_close_gpio_desc(dev);
    _Var11 = 0;
    if (((ulong)dev->num_chips != 0) &&
       (p_Var3 = dev->gpio_group, _Var11 = 0, p_Var3 != (_gpio_group *)0x0)) {
      lVar10 = 0;
      do {
        if (*(int *)((long)&p_Var3->is_required + lVar10) != 0) {
          __ptr = mraa_get_line_info_by_chip_number
                            (*(uint *)((long)&p_Var3->gpio_chip + lVar10),
                             **(uint **)((long)&p_Var3->gpio_lines + lVar10));
          if (__ptr == (mraa_gpiod_line_info *)0x0) {
            syslog(3,"[GPIOD_INTERFACE]: error getting line info");
            return MRAA_ERROR_UNSPECIFIED;
          }
          _Var11 = __ptr->flags;
          free(__ptr);
          goto LAB_0010b424;
        }
        lVar10 = lVar10 + 0x40;
      } while ((ulong)dev->num_chips << 6 != lVar10);
      _Var11 = 0;
    }
LAB_0010b424:
    if (2 < mode - MRAA_GPIOD_ACTIVE_LOW) {
      return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
    }
    uVar5 = dev->num_chips;
    if (uVar5 != 0) {
      uVar1 = *(uint *)(&DAT_00123a9c + (ulong)(mode - MRAA_GPIOD_ACTIVE_LOW) * 4);
      lVar10 = 0;
      uVar12 = 0;
      do {
        p_Var3 = dev->gpio_group;
        if (p_Var3 == (_gpio_group *)0x0) break;
        if (*(int *)((long)&p_Var3->is_required + lVar10) != 0) {
          iVar6 = mraa_get_lines_handle
                            (*(int *)((long)&p_Var3->dev_fd + lVar10),
                             *(uint **)((long)&p_Var3->gpio_lines + lVar10),
                             *(uint *)((long)&p_Var3->num_gpio_lines + lVar10),_Var11 | uVar1,0);
          if (iVar6 < 1) {
            syslog(3,"[GPIOD_INTERFACE]: error getting line handle");
            return MRAA_ERROR_INVALID_RESOURCE;
          }
          *(int *)((long)&p_Var3->gpiod_handle + lVar10) = iVar6;
          uVar5 = dev->num_chips;
        }
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x40;
      } while (uVar12 < uVar5);
    }
    goto LAB_0010b4f6;
  }
  if (dev->value_fp != -1) {
    close(dev->value_fp);
    dev->value_fp = -1;
  }
  snprintf(local_78,0x40,"/sys/class/gpio/gpio%d/drive",(ulong)(uint)dev->pin);
  mVar4 = MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
  iVar6 = open(local_78,1);
  if (iVar6 == -1) {
    uVar5 = dev->pin;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    syslog(3,"gpio%i: mode: Failed to open \'drive\' for writing: %s",(ulong)uVar5,pcVar8);
    return MRAA_ERROR_INVALID_RESOURCE;
  }
  switch(mode) {
  case MRAA_GPIO_STRONG:
    local_b8 = CONCAT17(local_b8._7_1_,0x676e6f000000);
    local_b8 = CONCAT44(local_b8._4_4_,0x6f727473);
    goto LAB_0010b4da;
  case MRAA_GPIO_PULLUP:
    local_b8 = CONCAT17(local_b8._7_1_,0x70756c000000);
    local_b8 = CONCAT44(local_b8._4_4_,0x6c6c7570);
LAB_0010b4da:
    __n = 6;
    break;
  case MRAA_GPIO_PULLDOWN:
    local_b8 = 0x6e776f646c6c7570;
    local_b0 = 0;
    __n = 8;
    break;
  case MRAA_GPIO_HIZ:
    local_b8 = CONCAT44(local_b8._4_4_,0x7a6968);
    __n = 3;
    break;
  default:
    goto switchD_0010b3be_default;
  }
  sVar9 = write(iVar6,&local_b8,__n);
  if (sVar9 == -1) {
    uVar5 = dev->pin;
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    syslog(3,"gpio%i: mode: Failed to write to \'drive\': %s",(ulong)uVar5,pcVar8);
    mVar4 = MRAA_ERROR_INVALID_RESOURCE;
switchD_0010b3be_default:
    close(iVar6);
  }
  else {
    close(iVar6);
LAB_0010b4f6:
    mVar4 = MRAA_SUCCESS;
    if ((dev->advance_func != (mraa_adv_func_t *)0x0) &&
       (UNRECOVERED_JUMPTABLE = dev->advance_func->gpio_mode_post, mVar4 = MRAA_SUCCESS,
       UNRECOVERED_JUMPTABLE != (_func_mraa_result_t_mraa_gpio_context_mraa_gpio_mode_t *)0x0)) {
      mVar4 = (*UNRECOVERED_JUMPTABLE)(dev,mode);
      return mVar4;
    }
  }
  return mVar4;
}

Assistant:

mraa_result_t
mraa_gpio_mode(mraa_gpio_context dev, mraa_gpio_mode_t mode)
{
    if (dev == NULL) {
        syslog(LOG_ERR, "gpio: mode: context is invalid");
        return MRAA_ERROR_INVALID_HANDLE;
    }

    if (IS_FUNC_DEFINED(dev, gpio_mode_replace))
        return dev->advance_func->gpio_mode_replace(dev, mode);

    if (IS_FUNC_DEFINED(dev, gpio_mode_pre)) {
        mraa_result_t pre_ret = (dev->advance_func->gpio_mode_pre(dev, mode));
        if (pre_ret != MRAA_SUCCESS)
            return pre_ret;
    }

    if (plat->chardev_capable) {
        unsigned flags = 0;
        int line_handle;
        mraa_gpiod_group_t gpio_iter;

        _mraa_close_gpio_desc(dev);

        /* We save flag values from the first valid line. */
        for_each_gpio_group(gpio_iter, dev)
        {
            mraa_gpiod_line_info* linfo =
            mraa_get_line_info_by_chip_number(gpio_iter->gpio_chip, gpio_iter->gpio_lines[0]);
            if (!linfo) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting line info");
                return MRAA_ERROR_UNSPECIFIED;
            }
            flags = linfo->flags;
            free(linfo);

            /* We don't need to iterate any further. */
            break;
        }

        /* Without changing the API, for now, we can request only one mode per call. */
        switch (mode) {
            case MRAA_GPIOD_ACTIVE_LOW:
                flags |= GPIOHANDLE_REQUEST_ACTIVE_LOW;
                break;
            case MRAA_GPIOD_OPEN_DRAIN:
                flags |= GPIOHANDLE_REQUEST_OPEN_DRAIN;
                break;
            case MRAA_GPIOD_OPEN_SOURCE:
                flags |= GPIOHANDLE_REQUEST_OPEN_SOURCE;
                break;
            default:
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }

        for_each_gpio_group(gpio_iter, dev)
        {
            line_handle = mraa_get_lines_handle(gpio_iter->dev_fd, gpio_iter->gpio_lines,
                                                gpio_iter->num_gpio_lines, flags, 0);
            if (line_handle <= 0) {
                syslog(LOG_ERR, "[GPIOD_INTERFACE]: error getting line handle");
                return MRAA_ERROR_INVALID_RESOURCE;
            }

            gpio_iter->gpiod_handle = line_handle;
        }
    } else {

        if (dev->value_fp != -1) {
            close(dev->value_fp);
            dev->value_fp = -1;
        }

        char filepath[MAX_SIZE];
        snprintf(filepath, MAX_SIZE, SYSFS_CLASS_GPIO "/gpio%d/drive", dev->pin);

        int drive = open(filepath, O_WRONLY);
        if (drive == -1) {
            syslog(LOG_ERR, "gpio%i: mode: Failed to open 'drive' for writing: %s", dev->pin, strerror(errno));
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        char bu[MAX_SIZE];
        int length;
        switch (mode) {
            case MRAA_GPIO_STRONG:
                length = snprintf(bu, sizeof(bu), "strong");
                break;
            case MRAA_GPIO_PULLUP:
                length = snprintf(bu, sizeof(bu), "pullup");
                break;
            case MRAA_GPIO_PULLDOWN:
                length = snprintf(bu, sizeof(bu), "pulldown");
                break;
            case MRAA_GPIO_HIZ:
                length = snprintf(bu, sizeof(bu), "hiz");
                break;
            default:
                close(drive);
                return MRAA_ERROR_FEATURE_NOT_IMPLEMENTED;
        }
        if (write(drive, bu, length * sizeof(char)) == -1) {
            syslog(LOG_ERR, "gpio%i: mode: Failed to write to 'drive': %s", dev->pin, strerror(errno));
            close(drive);
            return MRAA_ERROR_INVALID_RESOURCE;
        }

        close(drive);
    }

    if (IS_FUNC_DEFINED(dev, gpio_mode_post))
        return dev->advance_func->gpio_mode_post(dev, mode);

    return MRAA_SUCCESS;
}